

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluator.cpp
# Opt level: O0

GCPtr<symbols::Object> __thiscall
evaluator::Evaluator::applyFunction
          (Evaluator *this,GCPtr<symbols::Object> *obj,
          vector<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_> *args)

{
  Object *pOVar1;
  FunctionObject *pFVar2;
  FunctionObject *local_e8;
  GCPtr<symbols::Object> local_c8;
  GCPtr<symbols::Object> evaluated;
  Env *env;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined1 local_78 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> message;
  GCPtr<symbols::FunctionObject> local_48;
  GCPtr<symbols::FunctionObject> function;
  string strValue;
  vector<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_> *args_local;
  GCPtr<symbols::Object> *obj_local;
  
  pOVar1 = GCPtr<symbols::Object>::operator->(obj);
  (*pOVar1->_vptr_Object[3])(&function);
  pOVar1 = GCPtr<symbols::Object>::unref(obj);
  if (pOVar1 == (Object *)0x0) {
    local_e8 = (FunctionObject *)0x0;
  }
  else {
    local_e8 = (FunctionObject *)
               __dynamic_cast(pOVar1,&symbols::Object::typeinfo,&symbols::FunctionObject::typeinfo,0
                             );
  }
  GCPtr<symbols::FunctionObject>::GCPtr(&local_48,local_e8);
  pFVar2 = GCPtr::operator_cast_to_FunctionObject_((GCPtr *)&local_48);
  if (pFVar2 == (FunctionObject *)0x0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&env,"\'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&function);
    std::operator+(&local_98,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&env,"\'");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                   &local_98," object not a callable");
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&env);
    std::__cxx11::string::~string((string *)local_78);
  }
  evaluated.addr = (Object *)extendFunctionEnv(&local_48,args);
  pFVar2 = GCPtr<symbols::FunctionObject>::operator->(&local_48);
  evalBlockStatement((Evaluator *)&local_c8,pFVar2->body,(Env *)evaluated.addr);
  pOVar1 = unWrapReturnvalue(&local_c8);
  GCPtr<symbols::Object>::GCPtr((GCPtr<symbols::Object> *)this,pOVar1);
  GCPtr<symbols::Object>::~GCPtr(&local_c8);
  GCPtr<symbols::FunctionObject>::~GCPtr(&local_48);
  std::__cxx11::string::~string((string *)&function);
  return (GCPtr<symbols::Object>)(Object *)this;
}

Assistant:

GCPtr<Object> Evaluator::applyFunction(GCPtr<Object>& obj, std::vector<GCPtr<Object>>& args){
       auto strValue = obj->toString();
       GCPtr<FunctionObject> function = dynamic_cast<FunctionObject*>(obj.unref());
       if( function == nullptr){
           auto message = "'"+ strValue + "'" + " object not a callable";

       }
       auto env = extendFunctionEnv(function, args);
       auto evaluated = evalBlockStatement(function->body, env);
       return unWrapReturnvalue(evaluated);
}